

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Irrlicht.cpp
# Opt level: O2

IrrlichtDevice * createDeviceEx(SIrrlichtCreationParameters *params)

{
  int iVar1;
  CIrrDeviceSDL *this;
  undefined4 extraout_var;
  
  if (params->DeviceType - EIDT_SDL < 2) {
    this = (CIrrDeviceSDL *)operator_new(0x1e0);
    irr::CIrrDeviceSDL::CIrrDeviceSDL(this,params);
    iVar1 = (*(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice[3])(this);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      return (IrrlichtDevice *)this;
    }
    if (params->DriverType == EDT_NULL) {
      return (IrrlichtDevice *)this;
    }
    (*(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice[0x15])(this);
    (**(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice)(this);
    irr::IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice +
               (long)(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice[-3]));
  }
  return (IrrlichtDevice *)0x0;
}

Assistant:

createDeviceEx(const SIrrlichtCreationParameters &params)
{

	IrrlichtDevice *dev = 0;

#ifdef _IRR_COMPILE_WITH_WINDOWS_DEVICE_
	if (params.DeviceType == EIDT_WIN32 || (!dev && params.DeviceType == EIDT_BEST))
		dev = new CIrrDeviceWin32(params);
#endif

#ifdef _IRR_COMPILE_WITH_OSX_DEVICE_
	if (params.DeviceType == EIDT_OSX || (!dev && params.DeviceType == EIDT_BEST))
		dev = new CIrrDeviceMacOSX(params);
#endif

#ifdef _IRR_COMPILE_WITH_X11_DEVICE_
	if (params.DeviceType == EIDT_X11 || (!dev && params.DeviceType == EIDT_BEST))
		dev = new CIrrDeviceLinux(params);
#endif

#ifdef _IRR_COMPILE_WITH_ANDROID_DEVICE_
	if (params.DeviceType == EIDT_ANDROID || (!dev && params.DeviceType == EIDT_BEST))
		dev = new CIrrDeviceAndroid(params);
#endif

#ifdef _IRR_COMPILE_WITH_SDL_DEVICE_
	if (params.DeviceType == EIDT_SDL || (!dev && params.DeviceType == EIDT_BEST))
		dev = new CIrrDeviceSDL(params);
#endif

	if (dev && !dev->getVideoDriver() && params.DriverType != video::EDT_NULL) {
		dev->closeDevice(); // destroy window
		dev->run();         // consume quit message
		dev->drop();
		dev = 0;
	}

	return dev;
}